

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O2

Matrix44<double> * __thiscall
Imath_3_2::Matrix44<double>::translate<float>(Matrix44<double> *this,Vec3<float> *t)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  dVar9 = (double)t->x;
  dVar11 = (double)t->y;
  dVar10 = (double)t->z;
  dVar1 = this->x[0][1];
  dVar2 = this->x[0][2];
  dVar3 = this->x[0][3];
  dVar4 = this->x[1][1];
  dVar5 = this->x[1][2];
  dVar6 = this->x[1][3];
  dVar7 = this->x[2][1];
  dVar8 = this->x[3][1];
  this->x[3][0] =
       this->x[3][0] + this->x[2][0] * dVar10 + this->x[0][0] * dVar9 + this->x[1][0] * dVar11;
  this->x[3][1] = dVar8 + dVar7 * dVar10 + dVar1 * dVar9 + dVar4 * dVar11;
  dVar1 = this->x[2][3];
  dVar4 = this->x[3][3];
  this->x[3][2] = this->x[3][2] + this->x[2][2] * dVar10 + dVar9 * dVar2 + dVar5 * dVar11;
  this->x[3][3] = dVar4 + dVar1 * dVar10 + dVar9 * dVar3 + dVar6 * dVar11;
  return this;
}

Assistant:

const Matrix44<T>&
                 Matrix44<T>::translate (const Vec3<S>& t) IMATH_NOEXCEPT
{
    x[3][0] += t.x * x[0][0] + t.y * x[1][0] + t.z * x[2][0];
    x[3][1] += t.x * x[0][1] + t.y * x[1][1] + t.z * x[2][1];
    x[3][2] += t.x * x[0][2] + t.y * x[1][2] + t.z * x[2][2];
    x[3][3] += t.x * x[0][3] + t.y * x[1][3] + t.z * x[2][3];

    return *this;
}